

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiMerger_p.h
# Opt level: O2

void __thiscall
BamTools::Internal::MultiMerger<BamTools::Algorithms::Sort::ByName>::Remove
          (MultiMerger<BamTools::Algorithms::Sort::ByName> *this,BamReader *reader)

{
  __type _Var1;
  const_iterator __position;
  string local_70;
  string local_50;
  
  if (reader != (BamReader *)0x0) {
    BamReader::GetFilename_abi_cxx11_(&local_70,reader);
    for (__position._M_node = (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)__position._M_node != &(this->m_data)._M_t._M_impl.super__Rb_tree_header;
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node)) {
      if (*(BamReader **)(__position._M_node + 1) != (BamReader *)0x0) {
        BamReader::GetFilename_abi_cxx11_(&local_50,*(BamReader **)(__position._M_node + 1));
        _Var1 = std::operator==(&local_50,&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        if (_Var1) {
          std::
          _Rb_tree<BamTools::Internal::MergeItem,BamTools::Internal::MergeItem,std::_Identity<BamTools::Internal::MergeItem>,BamTools::Internal::MergeItemSorter<BamTools::Algorithms::Sort::ByName>,std::allocator<BamTools::Internal::MergeItem>>
          ::erase_abi_cxx11_((_Rb_tree<BamTools::Internal::MergeItem,BamTools::Internal::MergeItem,std::_Identity<BamTools::Internal::MergeItem>,BamTools::Internal::MergeItemSorter<BamTools::Algorithms::Sort::ByName>,std::allocator<BamTools::Internal::MergeItem>>
                              *)&this->m_data,__position);
          break;
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

inline void MultiMerger<Compare>::Remove(BamReader* reader) {

    if ( reader == 0 ) return;
    const std::string& filenameToRemove = reader->GetFilename();

    // iterate over readers in cache
    DataIterator dataIter = m_data.begin();
    DataIterator dataEnd  = m_data.end();
    for ( ; dataIter != dataEnd; ++dataIter ) {
        const MergeItem& item = (*dataIter);
        const BamReader* itemReader = item.Reader;
        if ( itemReader == 0 ) continue;

        // remove iterator on match
        if ( itemReader->GetFilename() == filenameToRemove ) {
            m_data.erase(dataIter);
            return;
        }
    }
}